

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::
SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
::reallocateTo(SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
               *this,size_type newCapacity)

{
  undefined8 *puVar1;
  pointer pvVar2;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pvVar9;
  long lVar10;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)newCapacity;
  pvVar9 = (pointer)operator_new(newCapacity * 0x30);
  pvVar2 = this->data_;
  sVar3 = this->len;
  for (lVar10 = 0; sVar3 * 0x30 - lVar10 != 0; lVar10 = lVar10 + 0x30) {
    ctx = (EVP_PKEY_CTX *)
          ((long)&(pvVar2->
                  super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  ).
                  super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          + lVar10);
    puVar1 = (undefined8 *)
             ((long)&(pvVar9->
                     super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                     ).
                     super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                     .
                     super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                     .
                     super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                     .
                     super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                     .
                     super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
             + lVar10);
    uVar4 = *(undefined8 *)ctx;
    uVar5 = *(undefined8 *)(ctx + 8);
    uVar6 = *(undefined8 *)(ctx + 0x10);
    uVar7 = *(undefined8 *)(ctx + 0x18);
    uVar8 = *(undefined8 *)(ctx + 0x28);
    puVar1[4] = *(undefined8 *)(ctx + 0x20);
    puVar1[5] = uVar8;
    puVar1[2] = uVar6;
    puVar1[3] = uVar7;
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
  }
  cleanup(this,ctx);
  this->cap = newCapacity;
  this->data_ = pvVar9;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }